

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  FunctionPrototypeSyntax *args_3;
  ExternInterfaceMethodSyntax *pEVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_3 = (FunctionPrototypeSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExternInterfaceMethodSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,&local_50,args_3,&local_60);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExternInterfaceMethodSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExternInterfaceMethodSyntax>(
        *deepClone(node.attributes, alloc),
        node.externKeyword.deepClone(alloc),
        node.forkJoin.deepClone(alloc),
        *deepClone<FunctionPrototypeSyntax>(*node.prototype, alloc),
        node.semi.deepClone(alloc)
    );
}